

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL12_AudioCVT * AudioCVT20to12(SDL_AudioCVT *cvt20,SDL12_AudioCVT *cvt12)

{
  SDL_AudioFormat SVar1;
  int iVar2;
  
  (*SDL20_memset)(cvt12,0,0x88);
  cvt12->needed = cvt20->needed;
  SVar1 = cvt20->dst_format;
  cvt12->src_format = cvt20->src_format;
  cvt12->dst_format = SVar1;
  cvt12->rate_incr = cvt20->rate_incr;
  cvt12->buf = cvt20->buf;
  iVar2 = cvt20->len_cvt;
  cvt12->len = cvt20->len;
  cvt12->len_cvt = iVar2;
  cvt12->len_mult = cvt20->len_mult;
  cvt12->len_ratio = cvt20->len_ratio;
  (*SDL20_memcpy)(cvt12->filters,cvt20->filters,0x50);
  cvt12->filter_index = cvt20->filter_index;
  return cvt12;
}

Assistant:

static SDL12_AudioCVT *
AudioCVT20to12(const SDL_AudioCVT *cvt20, SDL12_AudioCVT *cvt12)
{
    SDL20_zerop(cvt12);
    cvt12->needed = cvt20->needed;
    cvt12->src_format = cvt20->src_format;
    cvt12->dst_format = cvt20->dst_format;
    cvt12->rate_incr = cvt20->rate_incr;
    cvt12->buf = cvt20->buf;
    cvt12->len = cvt20->len;
    cvt12->len_cvt = cvt20->len_cvt;
    cvt12->len_mult = cvt20->len_mult;
    cvt12->len_ratio = cvt20->len_ratio;
    SDL20_memcpy(cvt12->filters, cvt20->filters, sizeof (cvt20->filters));
    cvt12->filter_index = cvt20->filter_index;
    return cvt12;
}